

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::UpdateMaxTestNameWidth(cmCTestTestHandler *this)

{
  bool bVar1;
  int iVar2;
  ListOfTests *pLVar3;
  cmCTestTestProperties *p;
  iterator __end1;
  iterator __begin1;
  ListOfTests *__range1;
  size_type max;
  cmCTestTestHandler *this_local;
  
  iVar2 = cmCTest::GetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest);
  __range1 = (ListOfTests *)(long)iVar2;
  __end1 = std::
           vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ::begin(&this->TestList);
  p = (cmCTestTestProperties *)
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::end(&this->TestList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                                *)&p);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
    ::operator*(&__end1);
    pLVar3 = (ListOfTests *)std::__cxx11::string::size();
    if (__range1 < pLVar3) {
      __range1 = (ListOfTests *)std::__cxx11::string::size();
    }
    __gnu_cxx::
    __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
    ::operator++(&__end1);
  }
  iVar2 = cmCTest::GetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest);
  if ((ListOfTests *)(long)iVar2 != __range1) {
    cmCTest::SetMaxTestNameWidth((this->super_cmCTestGenericHandler).CTest,(int)__range1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::UpdateMaxTestNameWidth()
{
  std::string::size_type max = this->CTest->GetMaxTestNameWidth();
  for (cmCTestTestProperties& p : this->TestList) {
    if (max < p.Name.size()) {
      max = p.Name.size();
    }
  }
  if (static_cast<std::string::size_type>(
        this->CTest->GetMaxTestNameWidth()) != max) {
    this->CTest->SetMaxTestNameWidth(static_cast<int>(max));
  }
}